

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O1

unique_ptr<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::StructConstant,spvtools::opt::analysis::Struct_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
          (spvtools *this,Struct **args,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *args_1)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = *args;
  *puVar1 = &PTR__CompositeConstant_003ef958;
  std::
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  ::vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            *)(puVar1 + 2),args_1);
  *puVar1 = &PTR__CompositeConstant_003efb20;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}